

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

void __thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::maybe(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *other)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  this->valid_ = false;
  if (other->valid_ == true) {
    pbVar2 = operator->(other);
    (this->storage_).__align = (anon_struct_8_0_00000001_for___align)((long)&this->storage_ + 0x10);
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->storage_,pcVar1,pcVar1 + pbVar2->_M_string_length);
    this->valid_ = true;
  }
  return;
}

Assistant:

maybe (maybe const & other) noexcept (std::is_nothrow_copy_constructible<T>::value) {
            if (other.valid_) {
                new (&storage_) T (*other);
                valid_ = true;
            }
        }